

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O0

void __thiscall
stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::idle
          (MicrothreadManager<implementations::brainfck::BFImplementation> *this)

{
  bool bVar1;
  pointer ppVar2;
  reference p_Var3;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>_>
  local_60;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>_>
  local_58;
  iterator it_1;
  _Self local_38;
  _Self local_30;
  iterator it;
  vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
  cleanup_processes;
  MicrothreadManager<implementations::brainfck::BFImplementation> *this_local;
  
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
  ::vector((vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
            *)&it);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>
       ::begin(&this->threads);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>
         ::end(&this->threads);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
             ::operator->(&local_30);
    if (((ppVar2->second).super_MicrothreadBase.field_0xc & 1) == 0) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
               ::operator->(&local_30);
      bVar1 = Microthread<implementations::brainfck::BFImplementation>::isResolved(&ppVar2->second);
      if (bVar1) {
        it_1._M_current =
             (_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
              *)local_30._M_node;
        thread_remove_scheduling(this,(_threads_iterator)local_30._M_node);
        std::
        vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
        ::push_back((vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
                     *)&it,&local_30);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
    ::operator++(&local_30);
  }
  local_58._M_current =
       (_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
        *)std::
          vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
          ::begin((vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
                   *)&it);
  while( true ) {
    local_60._M_current =
         (_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
          *)std::
            vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
            ::end((vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
                   *)&it);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    p_Var3 = __gnu_cxx::
             __normal_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>_>
             ::operator*(&local_58);
    std::
    map<unsigned_int,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>>
    ::erase_abi_cxx11_((map<unsigned_int,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>>
                        *)&this->threads,p_Var3->_M_node);
    __gnu_cxx::
    __normal_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>_>
    ::operator++(&local_58);
  }
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
  ::~vector((vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
             *)&it);
  return;
}

Assistant:

virtual void idle() {
				std::vector<typename _threads_type::iterator> cleanup_processes;
				// Find processes to clean up
				for (auto it = threads.begin(); it != threads.end(); ++it) {
					if (it->second.watched == false && it->second.isResolved()) {
						thread_remove_scheduling(it);
						cleanup_processes.push_back(it);
					}
				}
				// Clean up the processes we found
				for (auto it = cleanup_processes.begin(); it != cleanup_processes.end(); ++it) {
					threads.erase(*it);
				}
			}